

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

sunrealtype N_VL1Norm_Serial(N_Vector x)

{
  sunrealtype *xd;
  sunrealtype sum;
  sunindextype N;
  sunindextype i;
  N_Vector x_local;
  
  sum = 0.0;
  for (i = 0; i < *x->content; i = i + 1) {
    sum = ABS(*(double *)(*(long *)((long)x->content + 0x10) + i * 8)) + sum;
  }
  return sum;
}

Assistant:

sunrealtype N_VL1Norm_Serial(N_Vector x)
{
  sunindextype i, N;
  sunrealtype sum, *xd;

  sum = ZERO;
  xd  = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  for (i = 0; i < N; i++) { sum += SUNRabs(xd[i]); }

  return (sum);
}